

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O3

bool __thiscall senjo::GoCommandHandle::Parse(GoCommandHandle *this,char *params)

{
  size_type __n;
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  bool *pbVar5;
  byte *pbVar6;
  Output *this_00;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  int *piVar10;
  bool invalid;
  bool local_119;
  byte *local_118;
  bool *local_110;
  size_type local_108;
  bool *local_100;
  int *local_f8;
  size_type local_f0;
  uint64_t *local_e8;
  int *local_e0;
  Output local_d8;
  long local_d0;
  _func_int *local_c8 [2];
  Output local_b8;
  byte *local_b0;
  string *local_a8;
  uint64_t *local_a0;
  string *local_98;
  uint64_t *local_90;
  string *local_88;
  uint64_t *local_80;
  string *local_78;
  uint64_t *local_70;
  string *local_68;
  uint64_t *local_60;
  string *local_58;
  string *local_50;
  string *local_48;
  long local_40;
  long local_38;
  
  local_118 = (byte *)params;
  if ((Parse(char_const*)::argBinc_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argBinc_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argBinc_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argBinc_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argBinc_abi_cxx11_,"binc","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argBinc_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argBinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argBtime_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argBtime_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argBtime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argBtime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argBtime_abi_cxx11_,"btime","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argBtime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argBtime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argDepth_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argDepth_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argDepth_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argDepth_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argDepth_abi_cxx11_,"depth","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argDepth_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argDepth_abi_cxx11_);
  }
  if ((Parse(char_const*)::argInfinite_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argInfinite_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argInfinite_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argInfinite_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argInfinite_abi_cxx11_,"infinite","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argInfinite_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argInfinite_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovestogo_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argMovestogo_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argMovestogo_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argMovestogo_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argMovestogo_abi_cxx11_,"movestogo","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argMovestogo_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovestogo_abi_cxx11_);
  }
  if ((Parse(char_const*)::argMovetime_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argMovetime_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argMovetime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argMovetime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argMovetime_abi_cxx11_,"movetime","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argMovetime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argMovetime_abi_cxx11_);
  }
  if ((Parse(char_const*)::argNodes_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argNodes_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argNodes_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argNodes_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argNodes_abi_cxx11_,"nodes","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argNodes_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argNodes_abi_cxx11_);
  }
  if ((Parse(char_const*)::argPonder_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argPonder_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argPonder_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argPonder_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argPonder_abi_cxx11_,"ponder","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argPonder_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argPonder_abi_cxx11_);
  }
  if ((Parse(char_const*)::argSearchmoves_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argSearchmoves_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argSearchmoves_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argSearchmoves_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argSearchmoves_abi_cxx11_,"searchmoves","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argSearchmoves_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argSearchmoves_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWinc_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argWinc_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argWinc_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argWinc_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argWinc_abi_cxx11_,"winc","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argWinc_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&Parse(char_const*)::argWinc_abi_cxx11_);
  }
  if ((Parse(char_const*)::argWtime_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(char_const*)::argWtime_abi_cxx11_), iVar4 != 0)) {
    Parse(char_const*)::argWtime_abi_cxx11_._M_dataplus._M_p =
         (pointer)&Parse(char_const*)::argWtime_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&Parse(char_const*)::argWtime_abi_cxx11_,"wtime","");
    __cxa_atexit(std::__cxx11::string::~string,&Parse(char_const*)::argWtime_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&Parse(char_const*)::argWtime_abi_cxx11_);
  }
  local_100 = &this->infinite;
  this->infinite = false;
  this->ponder = false;
  local_110 = &this->ponder;
  piVar10 = &this->depth;
  this->depth = 0;
  this->movestogo = 0;
  local_e0 = &this->movestogo;
  local_e8 = &this->binc;
  this->binc = 0;
  this->btime = 0;
  this->movetime = 0;
  this->nodes = 0;
  this->winc = 0;
  this->wtime = 0;
  __n = Parse(char_const*)::argPonder_abi_cxx11_._M_string_length;
  local_119 = false;
  if (local_118 != (byte *)0x0) {
    local_60 = &this->btime;
    local_70 = &this->movetime;
    local_80 = &this->nodes;
    local_90 = &this->winc;
    local_a0 = &this->wtime;
    local_108 = Parse(char_const*)::argSearchmoves_abi_cxx11_._M_string_length;
    local_48 = (string *)Parse(char_const*)::argDepth_abi_cxx11_._M_string_length;
    local_50 = (string *)Parse(char_const*)::argMovestogo_abi_cxx11_._M_string_length;
    local_58 = (string *)Parse(char_const*)::argBinc_abi_cxx11_._M_string_length;
    local_68 = (string *)Parse(char_const*)::argBtime_abi_cxx11_._M_string_length;
    local_78 = (string *)Parse(char_const*)::argMovetime_abi_cxx11_._M_string_length;
    local_88 = (string *)Parse(char_const*)::argNodes_abi_cxx11_._M_string_length;
    local_98 = (string *)Parse(char_const*)::argWinc_abi_cxx11_._M_string_length;
    local_a8 = (string *)Parse(char_const*)::argWtime_abi_cxx11_._M_string_length;
    local_f0 = Parse(char_const*)::argInfinite_abi_cxx11_._M_string_length;
    local_38 = Parse(char_const*)::argInfinite_abi_cxx11_._M_string_length + 1;
    local_40 = Parse(char_const*)::argPonder_abi_cxx11_._M_string_length + 1;
    do {
      bVar2 = *local_118;
      if (bVar2 == 0) goto LAB_00140715;
      pbVar8 = local_118 + local_38;
      pbVar7 = local_118 + local_40;
      while (pbVar6 = local_118, iVar4 = isspace((int)(char)bVar2), iVar4 != 0) {
        local_118 = pbVar6 + 1;
        bVar2 = pbVar6[1];
        pbVar8 = pbVar8 + 1;
        pbVar7 = pbVar7 + 1;
        if (bVar2 == 0) goto LAB_00140715;
      }
      local_f8 = piVar10;
      if ((local_108 != 0) &&
         (iVar4 = strncmp((char *)pbVar6,
                          Parse(char_const*)::argSearchmoves_abi_cxx11_._M_dataplus._M_p,local_108),
         iVar4 == 0)) {
        uVar9 = (uint)(char)pbVar6[local_108];
        if (uVar9 == 0) goto LAB_001406df;
        iVar4 = isspace(uVar9);
        if (iVar4 != 0) {
          pbVar6 = pbVar6 + local_108;
          goto LAB_001406c2;
        }
      }
      if ((local_f0 == 0) ||
         (iVar4 = strncmp((char *)pbVar6,Parse(char_const*)::argInfinite_abi_cxx11_._M_dataplus._M_p
                          ,local_f0), iVar4 != 0)) {
LAB_001403ed:
        if ((__n != 0) &&
           (iVar4 = strncmp((char *)pbVar6,Parse(char_const*)::argPonder_abi_cxx11_._M_dataplus._M_p
                            ,__n), iVar4 == 0)) {
          uVar9 = (uint)(char)pbVar6[__n];
          pbVar5 = local_110;
          pbVar1 = pbVar6 + __n;
          if (uVar9 != 0) {
            iVar4 = isspace(uVar9);
            pbVar8 = pbVar6 + __n;
            if (iVar4 == 0) goto LAB_0014040c;
            do {
              local_118 = pbVar8;
              pbVar8 = pbVar7;
              iVar4 = isspace((int)(char)uVar9);
              pbVar5 = local_110;
              pbVar1 = local_118;
              if (iVar4 == 0) break;
              uVar9 = (uint)*pbVar8;
              pbVar7 = pbVar8 + 1;
              pbVar1 = pbVar8;
            } while (*pbVar8 != 0);
          }
          goto LAB_00140626;
        }
LAB_0014040c:
        piVar10 = local_f8;
        bVar3 = NumberParam<int>((senjo *)Parse(char_const*)::argDepth_abi_cxx11_._M_dataplus._M_p,
                                 local_48,local_f8,(char **)&local_118,&local_119);
        if (((((!bVar3) &&
              (bVar3 = NumberParam<int>((senjo *)Parse(char_const*)::argMovestogo_abi_cxx11_.
                                                 _M_dataplus._M_p,local_50,local_e0,
                                        (char **)&local_118,&local_119), !bVar3)) &&
             (bVar3 = NumberParam<unsigned_long>
                                ((senjo *)Parse(char_const*)::argBinc_abi_cxx11_._M_dataplus._M_p,
                                 local_58,local_e8,(char **)&local_118,&local_119), !bVar3)) &&
            ((bVar3 = NumberParam<unsigned_long>
                                ((senjo *)Parse(char_const*)::argBtime_abi_cxx11_._M_dataplus._M_p,
                                 local_68,local_60,(char **)&local_118,&local_119), !bVar3 &&
             (bVar3 = NumberParam<unsigned_long>
                                ((senjo *)Parse(char_const*)::argMovetime_abi_cxx11_._M_dataplus.
                                          _M_p,local_78,local_70,(char **)&local_118,&local_119),
             !bVar3)))) &&
           ((bVar3 = NumberParam<unsigned_long>
                               ((senjo *)Parse(char_const*)::argNodes_abi_cxx11_._M_dataplus._M_p,
                                local_88,local_80,(char **)&local_118,&local_119), !bVar3 &&
            ((bVar3 = NumberParam<unsigned_long>
                                ((senjo *)Parse(char_const*)::argWinc_abi_cxx11_._M_dataplus._M_p,
                                 local_98,local_90,(char **)&local_118,&local_119), !bVar3 &&
             (bVar3 = NumberParam<unsigned_long>
                                ((senjo *)Parse(char_const*)::argWtime_abi_cxx11_._M_dataplus._M_p,
                                 local_a8,local_a0,(char **)&local_118,&local_119), !bVar3)))))) {
          Output::Output(&local_d8,InfoPrefix);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Unexpected token: ",0x12);
          Output::operator<<(&local_d8,(char **)&local_118);
          this_00 = &local_d8;
          goto LAB_001406af;
        }
      }
      else {
        uVar9 = (uint)(char)pbVar6[local_f0];
        pbVar5 = local_100;
        pbVar1 = pbVar6 + local_f0;
        if (uVar9 != 0) {
          local_b0 = pbVar6 + local_f0;
          iVar4 = isspace(uVar9);
          if (iVar4 == 0) goto LAB_001403ed;
          local_118 = local_b0;
          do {
            pbVar7 = pbVar8;
            iVar4 = isspace((int)(char)uVar9);
            pbVar5 = local_100;
            pbVar1 = local_118;
            if (iVar4 == 0) break;
            uVar9 = (uint)*pbVar7;
            pbVar8 = pbVar7 + 1;
            local_118 = pbVar7;
            pbVar1 = pbVar7;
          } while (*pbVar7 != 0);
        }
LAB_00140626:
        local_118 = pbVar1;
        *pbVar5 = true;
        piVar10 = local_f8;
      }
    } while ((local_119 == false) && (local_118 != (byte *)0x0));
    if (local_119 != false) {
      Output::Output(&local_b8,InfoPrefix);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
      (*(this->super_BackgroundCommand)._vptr_BackgroundCommand[3])(&local_d8,this);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_d8._vptr_Output,local_d0);
      if (local_d8._vptr_Output != local_c8) {
        operator_delete(local_d8._vptr_Output);
      }
      this_00 = &local_b8;
LAB_001406af:
      Output::~Output(this_00);
      return false;
    }
  }
  goto LAB_00140715;
  while (uVar9 = (uint)*pbVar6, local_118 = pbVar6, *pbVar6 != 0) {
LAB_001406c2:
    pbVar6 = pbVar6 + 1;
    iVar4 = isspace((int)(char)uVar9);
    if (iVar4 == 0) break;
  }
LAB_001406df:
  Output::Output(&local_d8,InfoPrefix);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"searchmoves not implemented!",0x1c);
  Output::~Output(&local_d8);
  piVar10 = local_f8;
LAB_00140715:
  if ((*local_100 != false) || (*local_110 == true)) {
    *piVar10 = 0;
    *local_e0 = 0;
    local_e8[4] = 0;
    local_e8[5] = 0;
    local_e8[2] = 0;
    local_e8[3] = 0;
    *local_e8 = 0;
    local_e8[1] = 0;
  }
  return true;
}

Assistant:

bool GoCommandHandle::Parse(const char* params)
{
  static const std::string argBinc        = "binc";
  static const std::string argBtime       = "btime";
  static const std::string argDepth       = "depth";
  static const std::string argInfinite    = "infinite";
  static const std::string argMovestogo   = "movestogo";
  static const std::string argMovetime    = "movetime";
  static const std::string argNodes       = "nodes";
  static const std::string argPonder      = "ponder";
  static const std::string argSearchmoves = "searchmoves";
  static const std::string argWinc        = "winc";
  static const std::string argWtime       = "wtime";

  infinite  = false;
  ponder    = false;
  depth     = 0;
  movestogo = 0;
  binc      = 0;
  btime     = 0;
  movetime  = 0;
  nodes     = 0;
  winc      = 0;
  wtime     = 0;

  bool invalid = false;
  while (!invalid && params && *NextWord(params)) {
    if (ParamMatch(argSearchmoves, params)) {
      Output() << "searchmoves not implemented!"; // TODO
      break;
    }
    if (HasParam(argInfinite,     infinite,  params) ||
        HasParam(argPonder,       ponder,    params) ||
        NumberParam(argDepth,     depth,     params, invalid) ||
        NumberParam(argMovestogo, movestogo, params, invalid) ||
        NumberParam(argBinc,      binc,      params, invalid) ||
        NumberParam(argBtime,     btime,     params, invalid) ||
        NumberParam(argMovetime,  movetime,  params, invalid) ||
        NumberParam(argNodes,     nodes,     params, invalid) ||
        NumberParam(argWinc,      winc,      params, invalid) ||
        NumberParam(argWtime,     wtime,     params, invalid))
    {
      continue;
    }
    Output() << "Unexpected token: " << params;
    return false;
  }
  if (invalid) {
    Output() << "usage: " << Usage();
    return false;
  }

  if (infinite || ponder) {
    depth     = 0;
    movestogo = 0;
    binc      = 0;
    btime     = 0;
    movetime  = 0;
    nodes     = 0;
    winc      = 0;
    wtime     = 0;
  }

  return true;
}